

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genx.c
# Opt level: O0

genxWriter
genxNew(_func_void_ptr_void_ptr_int *alloc,_func_void_void_ptr_void_ptr *dealloc,void *userData)

{
  genxStatus gVar1;
  int iVar2;
  undefined4 extraout_var;
  genxAttribute_conflict pgVar3;
  genxNamespace pgVar4;
  void *in_RDX;
  _func_void_void_ptr_void_ptr *in_RSI;
  _func_void_ptr_void_ptr_int *in_RDI;
  genxNamespace unaff_retaddr;
  genxNamespace xml;
  genxWriter w;
  genxStatus *in_stack_00000040;
  constUtf8 in_stack_00000048;
  constUtf8 in_stack_00000050;
  genxWriter in_stack_00000058;
  genxWriter in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  genxWriter local_28;
  constUtf8 in_stack_fffffffffffffff8;
  
  if (in_RDI == (_func_void_ptr_void_ptr_int *)0x0) {
    local_28 = (genxWriter)malloc(0x10420);
  }
  else {
    local_28 = (genxWriter)(*in_RDI)(in_RDX,0x10420);
  }
  if (local_28 != (genxWriter)0x0) {
    local_28->status = GENX_SUCCESS;
    local_28->alloc = in_RDI;
    local_28->dealloc = in_RSI;
    local_28->userData = in_RDX;
    local_28->sequence = SEQUENCE_NO_DOC;
    gVar1 = initPlist(in_stack_ffffffffffffffc8,(plist *)0x2807a9);
    if ((((gVar1 == GENX_SUCCESS) &&
         (gVar1 = initPlist(in_stack_ffffffffffffffc8,(plist *)0x2807c4), gVar1 == GENX_SUCCESS)) &&
        (gVar1 = initPlist(in_stack_ffffffffffffffc8,(plist *)0x2807df), gVar1 == GENX_SUCCESS)) &&
       ((gVar1 = initPlist(in_stack_ffffffffffffffc8,(plist *)0x2807fa), gVar1 == GENX_SUCCESS &&
        (gVar1 = initPlist(in_stack_ffffffffffffffc8,(plist *)0x280815), gVar1 == GENX_SUCCESS)))) {
      gVar1 = initCollector(in_stack_ffffffffffffffc8,(collector *)0x280842);
      local_28->status = gVar1;
      if (gVar1 != GENX_SUCCESS) {
        return (genxWriter)0x0;
      }
      iVar2 = copy((EVP_PKEY_CTX *)local_28,(EVP_PKEY_CTX *)"");
      local_28->empty = (utf8)CONCAT44(extraout_var,iVar2);
      if ((utf8)CONCAT44(extraout_var,iVar2) != (utf8)0x0) {
        pgVar3 = declareAttribute((genxWriter)xml,unaff_retaddr,in_stack_fffffffffffffff8,
                                  (constUtf8)in_RDI,(genxStatus *)in_RSI);
        local_28->xmlnsEquals = pgVar3;
        if ((local_28->xmlnsEquals != (genxAttribute_conflict)0x0) &&
           (local_28->status == GENX_SUCCESS)) {
          local_28->defaultNsDeclared = 0;
          local_28->nextPrefix = 1;
          genxSetCharProps(in_stack_ffffffffffffffd0);
          local_28->etext[0] = "Success";
          local_28->etext[1] = "Bad UTF8";
          local_28->etext[2] = "Non XML Character";
          local_28->etext[3] = "Bad NAME";
          local_28->etext[4] = "Memory allocation failed";
          local_28->etext[5] = "Bad namespace name";
          local_28->etext[6] = "Internal error";
          local_28->etext[7] = "Duplicate prefix";
          local_28->etext[8] = "Call out of sequence";
          local_28->etext[9] = "No Start-tag for EndElement call";
          local_28->etext[10] = "I/O error";
          local_28->etext[0xb] = "Missing attribute value";
          local_28->etext[0xc] = "Malformed comment body";
          local_28->etext[0xe] = "?> in PI";
          local_28->etext[0xd] = "Target of PI matches [xX][mM][lL]";
          local_28->etext[0xf] = "Same attribute specified more than once";
          local_28->etext[0x10] = "Attribute cannot be in default namespace";
          local_28->etext[0x11] = "Declared namespace twice with different prefixes on one element."
          ;
          local_28->etext[0x12] =
               "Declared a default namespace on an element which is in no namespace";
          pgVar4 = genxDeclareNamespace
                             (in_stack_00000058,in_stack_00000050,in_stack_00000048,
                              in_stack_00000040);
          if (pgVar4 != (genxNamespace)0x0) {
            pgVar4->declCount = 1;
            pgVar4->declaration = pgVar4->defaultDecl;
            return local_28;
          }
          return (genxWriter)0x0;
        }
        return (genxWriter)0x0;
      }
      local_28->status = GENX_ALLOC_FAILED;
      return (genxWriter)0x0;
    }
  }
  return (genxWriter)0x0;
}

Assistant:

genxWriter genxNew(void * (* alloc)(void * userData, int bytes),
		   void (* dealloc)(void * userData, void * data),
		   void * userData)
{
  genxWriter w;
  genxNamespace xml;

  if (alloc)
    w = (genxWriter) (*alloc)(userData, sizeof(struct genxWriter_rec));
  else
    w = (genxWriter) malloc(sizeof(struct genxWriter_rec));

  if (w == NULL)
    return NULL;

  w->status = GENX_SUCCESS;
  w->alloc = alloc;
  w->dealloc = dealloc;
  w->userData = userData;
  w->sequence = SEQUENCE_NO_DOC;

  if (initPlist(w, &w->namespaces) != GENX_SUCCESS ||
      initPlist(w, &w->elements) != GENX_SUCCESS ||
      initPlist(w, &w->attributes) != GENX_SUCCESS ||
      initPlist(w, &w->prefixes) != GENX_SUCCESS ||
      initPlist(w, &w->stack) != GENX_SUCCESS)
    return NULL;

  if ((w->status = initCollector(w, &w->arec.value)) != GENX_SUCCESS)
    return NULL;

  if ((w->empty = copy(w, (utf8) "")) == NULL)
  {
    w->status = GENX_ALLOC_FAILED;
    return NULL;
  }

  w->xmlnsEquals = declareAttribute(w, NULL, (utf8) "xmlns", NULL, &w->status);
  if (w->xmlnsEquals == NULL || w->status != GENX_SUCCESS)
    return NULL;
  w->defaultNsDeclared = False;

  w->nextPrefix = 1;

  genxSetCharProps(w->xmlChars);

  w->etext[GENX_SUCCESS] = "Success";
  w->etext[GENX_BAD_UTF8] = "Bad UTF8";
  w->etext[GENX_NON_XML_CHARACTER] = "Non XML Character";
  w->etext[GENX_BAD_NAME] = "Bad NAME";
  w->etext[GENX_ALLOC_FAILED] = "Memory allocation failed";
  w->etext[GENX_BAD_NAMESPACE_NAME] = "Bad namespace name";
  w->etext[GENX_INTERNAL_ERROR] = "Internal error";
  w->etext[GENX_DUPLICATE_PREFIX] = "Duplicate prefix";
  w->etext[GENX_SEQUENCE_ERROR] = "Call out of sequence";
  w->etext[GENX_NO_START_TAG] = "No Start-tag for EndElement call";
  w->etext[GENX_IO_ERROR] = "I/O error";
  w->etext[GENX_MISSING_VALUE] = "Missing attribute value";
  w->etext[GENX_MALFORMED_COMMENT] = "Malformed comment body";
  w->etext[GENX_MALFORMED_PI] = "?> in PI";
  w->etext[GENX_XML_PI_TARGET] = "Target of PI matches [xX][mM][lL]";
  w->etext[GENX_DUPLICATE_ATTRIBUTE] =
    "Same attribute specified more than once";
  w->etext[GENX_ATTRIBUTE_IN_DEFAULT_NAMESPACE] =
    "Attribute cannot be in default namespace";
  w->etext[GENX_DUPLICATE_NAMESPACE] =
    "Declared namespace twice with different prefixes on one element.";
  w->etext[GENX_BAD_DEFAULT_DECLARATION] =
    "Declared a default namespace on an element which is in no namespace";

  /* the xml: namespace is pre-wired */
  xml = genxDeclareNamespace(w, (utf8) "http://www.w3.org/XML/1998/namespace",
			     (utf8) "xml", &w->status);
  if (xml == NULL)
    return NULL;
  xml->declCount = 1;
  xml->declaration = xml->defaultDecl;

  return w;
}